

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,Ptr<Catch::TestSpec::Pattern> *underlyingPattern)

{
  Pattern *pPVar1;
  
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.m_rc = 0;
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__ExcludedPattern_0017ce90;
  pPVar1 = underlyingPattern->m_p;
  (this->m_underlyingPattern).m_p = pPVar1;
  if (pPVar1 != (Pattern *)0x0) {
    (*(pPVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [2])();
    return;
  }
  return;
}

Assistant:

ExcludedPattern( Ptr<Pattern> const& underlyingPattern ) : m_underlyingPattern( underlyingPattern ) {}